

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBackwardCompatibility.cpp
# Opt level: O0

void anon_unknown.dwarf_2bc81::generateTiledImage(char *fn)

{
  int iVar1;
  int iVar2;
  RZ *pRVar3;
  char *pcVar4;
  undefined4 *puVar5;
  char *in_RDI;
  FrameBuffer frameBuffer;
  TiledOutputFile out;
  int tileH;
  int tileW;
  Header header;
  int j;
  int i;
  Array2D<(anonymous_namespace)::RZ> rz;
  float in_stack_fffffffffffffe1c;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffe24;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  Array2D<(anonymous_namespace)::RZ> *in_stack_fffffffffffffe40;
  Slice local_170 [56];
  Slice local_138 [56];
  char local_100 [48];
  undefined1 local_d0 [48];
  undefined4 local_a0;
  undefined4 local_9c;
  Channel local_98 [16];
  Channel local_88 [16];
  Vec2<float> local_78;
  TileDescription local_70 [3];
  uint16_t local_36;
  int local_34;
  int local_30;
  Array2D<(anonymous_namespace)::RZ> local_20;
  char *local_8;
  
  local_8 = in_RDI;
  Imf_3_4::Array2D<(anonymous_namespace)::RZ>::Array2D
            ((Array2D<(anonymous_namespace)::RZ> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
             CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  Imf_3_4::Array2D<(anonymous_namespace)::RZ>::resizeErase
            (in_stack_fffffffffffffe40,CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38)
             ,CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  for (local_30 = 0; local_30 < 0xc5; local_30 = local_30 + 1) {
    for (local_34 = 0; local_34 < 0xd9; local_34 = local_34 + 1) {
      iVar1 = local_30 * 0xd9 + local_34;
      pRVar3 = Imf_3_4::Array2D<(anonymous_namespace)::RZ>::operator[](&local_20,(long)local_30);
      pRVar3[local_34].z = (float)iVar1 / 42749.0;
      Imf_3_4::Array2D<(anonymous_namespace)::RZ>::operator[](&local_20,(long)local_30);
      Imath_3_2::half::half
                ((half *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 in_stack_fffffffffffffe1c);
      pRVar3 = Imf_3_4::Array2D<(anonymous_namespace)::RZ>::operator[](&local_20,(long)local_30);
      pRVar3[local_34].g._h = local_36;
    }
  }
  Imath_3_2::Vec2<float>::Vec2(&local_78,0.0,0.0);
  Imf_3_4::Header::Header
            ((Header *)local_70,0xd9,0xc5,1.0,(Vec2 *)&local_78,1.0,INCREASING_Y,ZIP_COMPRESSION);
  pcVar4 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel(local_88,HALF,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar4,(Channel *)0x225766);
  pcVar4 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel(local_98,FLOAT,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar4,(Channel *)0x23242c);
  puVar5 = (undefined4 *)Imf_3_4::Header::compression();
  *puVar5 = 0;
  local_9c = 0xc;
  local_a0 = 0x18;
  Imf_3_4::TileDescription::TileDescription
            ((TileDescription *)(local_d0 + 0x20),0xc,0x18,ONE_LEVEL,ROUND_DOWN);
  Imf_3_4::Header::setTileDescription(local_70);
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledOutputFile::TiledOutputFile
            ((TiledOutputFile *)local_d0,local_8,(Header *)local_70,iVar1);
  Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x1413e8);
  pRVar3 = Imf_3_4::Array2D<(anonymous_namespace)::RZ>::operator[](&local_20,0);
  Imf_3_4::Slice::Slice(local_138,HALF,(char *)&pRVar3->g,8,0x6c8,1,1,0.0,false,false);
  Imf_3_4::FrameBuffer::insert(local_100,(Slice *)0x225766);
  pRVar3 = Imf_3_4::Array2D<(anonymous_namespace)::RZ>::operator[](&local_20,0);
  uVar6 = 0;
  Imf_3_4::Slice::Slice(local_170,FLOAT,(char *)pRVar3,8,0x6c8,1,1,0.0,false,false);
  Imf_3_4::FrameBuffer::insert(local_100,(Slice *)0x23242c);
  Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)local_d0);
  iVar1 = Imf_3_4::TiledOutputFile::numXTiles((int)local_d0);
  iVar1 = iVar1 + -1;
  iVar2 = Imf_3_4::TiledOutputFile::numYTiles((int)local_d0);
  Imf_3_4::TiledOutputFile::writeTiles((int)local_d0,0,iVar1,0,iVar2 + -1);
  Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x141542);
  Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)local_d0);
  Imf_3_4::Header::~Header((Header *)local_70);
  Imf_3_4::Array2D<(anonymous_namespace)::RZ>::~Array2D
            ((Array2D<(anonymous_namespace)::RZ> *)CONCAT44(in_stack_fffffffffffffe24,uVar6));
  return;
}

Assistant:

void
generateTiledImage (const char* fn)
{
    Array2D<RZ> rz (H, W);
    rz.resizeErase (H, W);

    for (int i = 0; i < H; i++)
    {
        for (int j = 0; j < W; j++)
        {
            rz[i][j].z = (float) ((i * W + j) / (float (W * H)));
            rz[i][j].g = (half) (rz[i][j].z);
        }
    }

    Header header (W, H);
    header.channels ().insert ("G", Channel (IMF::HALF));
    header.channels ().insert ("Z", Channel (IMF::FLOAT));
    header.compression () = NO_COMPRESSION;

    int tileW = 12;
    int tileH = 24;
    header.setTileDescription (TileDescription (tileW, tileH, ONE_LEVEL));

    OPENEXR_IMF_NAMESPACE::TiledOutputFile out (fn, header);
    OPENEXR_IMF_NAMESPACE::FrameBuffer     frameBuffer; // 6
    frameBuffer.insert (
        "G",
        Slice (
            IMF::HALF,
            (char*) &rz[0][0].g,
            sizeof (rz[0][0]) * 1,
            sizeof (rz[0][0]) * W));

    frameBuffer.insert (
        "Z",
        Slice (
            IMF::FLOAT,
            (char*) &rz[0][0].z,
            sizeof (rz[0][0]) * 1,
            sizeof (rz[0][0]) * W));

    out.setFrameBuffer (frameBuffer);
    out.writeTiles (0, out.numXTiles () - 1, 0, out.numYTiles () - 1);
}